

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void clunk::InitKingMoves(int from)

{
  bool bVar1;
  uint to_00;
  int iVar2;
  int local_48;
  int to;
  int i;
  int shift;
  uint64_t mvs;
  int dir [8];
  int from_local;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x24c,"void clunk::InitKingMoves(const int)");
  }
  dir[0] = -0xf;
  dir[1] = -1;
  dir[2] = 1;
  dir[3] = 0xf;
  dir[4] = 0x10;
  dir[5] = 0x11;
  _i = 0;
  to = 0;
  local_48 = 0;
  do {
    if (7 < local_48) {
      bVar1 = VerifyMoveMap(from,_i);
      if (!bVar1) {
        __assert_fail("VerifyMoveMap(from, mvs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x25c,"void clunk::InitKingMoves(const int)");
      }
      *(ulong *)(_queenKing + (long)(from + 8) * 8) = _i;
      return;
    }
    to_00 = from + dir[(long)local_48 + -2];
    if ((to_00 & 0xffffff88) == 0) {
      iVar2 = Direction(from,to_00);
      if (iVar2 != dir[(long)local_48 + -2]) {
        __assert_fail("Direction(from, to) == dir[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x256,"void clunk::InitKingMoves(const int)");
      }
      if (0x38 < to) {
        __assert_fail("shift <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,599,"void clunk::InitKingMoves(const int)");
      }
      _i = (long)(int)(to_00 + 1) << ((byte)to & 0x3f) | _i;
      to = to + 8;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void InitKingMoves(const int from) {
  assert(IS_SQUARE(from));
  const int dir[8] = {
    SouthWest, South, SouthEast, West,
    East, NorthWest, North, NorthEast
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 8; ++i) {
    const int to = (from + dir[i]);
    if (IS_SQUARE(to)) {
      assert(Direction(from, to) == dir[i]);
      assert(shift <= 56);
      mvs |= (uint64_t(to + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _queenKing[from + 8] = mvs;
}